

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_delete_function(unqlite_vm *pVm,char *zName)

{
  jx9_vm *pBackend;
  char *pcVar1;
  sxi32 sVar2;
  char *pcVar3;
  jx9_user_func *pFunc;
  void *local_18;
  
  sVar2 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pBackend = pVm->pJx9Vm;
    local_18 = (void *)0x0;
    pcVar3 = zName;
    if (*zName != '\0') {
      pcVar1 = zName + 2;
      do {
        pcVar3 = pcVar1;
        if (pcVar3[-1] == '\0') {
          pcVar3 = pcVar3 + -1;
          goto LAB_0010c488;
        }
        if (*pcVar3 == '\0') goto LAB_0010c488;
        if (pcVar3[1] == '\0') {
          pcVar3 = pcVar3 + 1;
          goto LAB_0010c488;
        }
        pcVar1 = pcVar3 + 4;
      } while (pcVar3[2] != '\0');
      pcVar3 = pcVar3 + 2;
    }
LAB_0010c488:
    sVar2 = SyHashDeleteEntry(&pBackend->hHostFunction,zName,(int)pcVar3 - (int)zName,&local_18);
    if (sVar2 == 0) {
      SySetRelease((SySet *)((long)local_18 + 0x28));
      SyMemBackendFree(&pBackend->sAllocator,*(void **)((long)local_18 + 8));
      SyMemBackendPoolFree(&pBackend->sAllocator,local_18);
    }
  }
  return sVar2;
}

Assistant:

int unqlite_delete_function(unqlite_vm *pVm, const char *zName)
{
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Unlink the foreign function */
	 rc = jx9DeleteFunction(pVm->pJx9Vm,zName);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}